

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cc
# Opt level: O3

void __thiscall
cnn::LSTMBuilder::LSTMBuilder
          (LSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,Model *model)

{
  undefined4 *puVar1;
  long lVar2;
  Parameters *pPVar3;
  Parameters *pPVar4;
  ulong uVar5;
  ulong uVar6;
  uint v;
  uint uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  initializer_list<cnn::Parameters_*> __l;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> ps;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> local_108;
  allocator_type local_ed;
  uint local_ec;
  LSTMBuilder *local_e8;
  undefined1 local_e0 [16];
  Parameters *local_d0;
  uint uStack_c8;
  uint local_c4;
  uint uStack_c0;
  undefined4 uStack_bc;
  Parameters *local_b8;
  Parameters *local_b0;
  Parameters *local_a8;
  Parameters *local_a0;
  Parameters *local_98;
  Parameters *local_90;
  uint local_84;
  vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  *local_80;
  Parameters *local_78;
  ulong local_70;
  Parameters *local_68;
  Parameters *local_60;
  Parameters *local_58;
  Parameters *local_50;
  Parameters *local_48;
  Parameters *local_40;
  Parameters *local_38;
  
  (this->super_RNNBuilder).cur.t = -1;
  *(undefined8 *)&(this->super_RNNBuilder).sm = 0;
  *(undefined8 *)
   ((long)&(this->super_RNNBuilder).head.
           super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (this->super_RNNBuilder).head.
  super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RNNBuilder).head.
  super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar9 = ZEXT464(0) << 0x40;
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__LSTMBuilder_002e16d0;
  this->params = (vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                  )auVar9._0_24_;
  this->param_vars =
       (vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
        )auVar9._24_24_;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar9._48_8_;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar9._56_8_;
  *(undefined1 (*) [64])
   &(this->param_vars).
    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar9;
  auVar8 = ZEXT432(0) << 0x40;
  this->h0 = (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>)auVar8._0_24_;
  (this->c0).super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auVar8._24_8_;
  *(undefined1 (*) [32])
   &(this->h0).super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = auVar8;
  this->layers = layers;
  local_e8 = this;
  if (layers != 0) {
    uVar6 = 0;
    local_80 = &this->params;
    local_84 = layers;
    local_ec = input_dim;
    do {
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = local_ec;
      lVar2 = 0;
      local_c4 = 0;
      uStack_c0 = 1;
      do {
        uVar5 = (ulong)local_c4;
        puVar1 = (undefined4 *)
                 ((long)&local_108.
                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
        local_c4 = local_c4 + 1;
        *(undefined4 *)(local_e0 + uVar5 * 4) = *puVar1;
      } while (lVar2 != 8);
      pPVar3 = Model::add_parameters(model,(Dim *)local_e0,0.0);
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      lVar2 = 0;
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = hidden_dim;
      local_c4 = 0;
      uStack_c0 = 1;
      do {
        uVar5 = (ulong)local_c4;
        puVar1 = (undefined4 *)
                 ((long)&local_108.
                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
        local_c4 = local_c4 + 1;
        *(undefined4 *)(local_e0 + uVar5 * 4) = *puVar1;
      } while (lVar2 != 8);
      local_38 = Model::add_parameters(model,(Dim *)local_e0,0.0);
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      lVar2 = 0;
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = hidden_dim;
      local_c4 = 0;
      uStack_c0 = 1;
      do {
        uVar5 = (ulong)local_c4;
        puVar1 = (undefined4 *)
                 ((long)&local_108.
                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
        local_c4 = local_c4 + 1;
        *(undefined4 *)(local_e0 + uVar5 * 4) = *puVar1;
      } while (lVar2 != 8);
      local_40 = Model::add_parameters(model,(Dim *)local_e0,0.0);
      local_c4 = 1;
      uStack_c0 = 1;
      local_e0._0_4_ = hidden_dim;
      local_48 = Model::add_parameters(model,(Dim *)local_e0,0.0);
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_c4 = 0;
      uStack_c0 = 1;
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = local_ec;
      lVar2 = 0;
      do {
        uVar5 = (ulong)local_c4;
        puVar1 = (undefined4 *)
                 ((long)&local_108.
                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
        local_c4 = local_c4 + 1;
        *(undefined4 *)(local_e0 + uVar5 * 4) = *puVar1;
      } while (lVar2 != 8);
      local_50 = Model::add_parameters(model,(Dim *)local_e0,0.0);
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      lVar2 = 0;
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = hidden_dim;
      local_c4 = 0;
      uStack_c0 = 1;
      do {
        uVar5 = (ulong)local_c4;
        puVar1 = (undefined4 *)
                 ((long)&local_108.
                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
        local_c4 = local_c4 + 1;
        *(undefined4 *)(local_e0 + uVar5 * 4) = *puVar1;
      } while (lVar2 != 8);
      local_58 = Model::add_parameters(model,(Dim *)local_e0,0.0);
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      lVar2 = 0;
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = hidden_dim;
      local_c4 = 0;
      uStack_c0 = 1;
      do {
        uVar5 = (ulong)local_c4;
        puVar1 = (undefined4 *)
                 ((long)&local_108.
                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
        local_c4 = local_c4 + 1;
        *(undefined4 *)(local_e0 + uVar5 * 4) = *puVar1;
      } while (lVar2 != 8);
      local_70 = uVar6;
      local_60 = pPVar3;
      local_68 = Model::add_parameters(model,(Dim *)local_e0,0.0);
      local_c4 = 1;
      uStack_c0 = 1;
      local_78 = Model::add_parameters(model,(Dim *)local_e0,0.0);
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = local_ec;
      local_c4 = 0;
      uStack_c0 = 1;
      lVar2 = 0;
      do {
        uVar6 = (ulong)local_c4;
        puVar1 = (undefined4 *)
                 ((long)&local_108.
                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
        local_c4 = local_c4 + 1;
        *(undefined4 *)(local_e0 + uVar6 * 4) = *puVar1;
      } while (lVar2 != 8);
      pPVar3 = Model::add_parameters(model,(Dim *)local_e0,0.0);
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = hidden_dim;
      local_108.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = hidden_dim;
      local_c4 = 0;
      uStack_c0 = 1;
      lVar2 = 0;
      do {
        uVar6 = (ulong)local_c4;
        puVar1 = (undefined4 *)
                 ((long)&local_108.
                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
        local_c4 = local_c4 + 1;
        *(undefined4 *)(local_e0 + uVar6 * 4) = *puVar1;
      } while (lVar2 != 8);
      pPVar4 = Model::add_parameters(model,(Dim *)local_e0,0.0);
      local_c4 = 1;
      uStack_c0 = 1;
      local_90 = Model::add_parameters(model,(Dim *)local_e0,0.0);
      local_e0._0_8_ = local_60;
      local_e0._8_8_ = local_38;
      local_d0 = local_40;
      uStack_c8 = (uint)local_48;
      local_c4 = (uint)((ulong)local_48 >> 0x20);
      uStack_c0 = (uint)local_50;
      uStack_bc = (undefined4)((ulong)local_50 >> 0x20);
      local_b8 = local_58;
      local_b0 = local_68;
      local_a8 = local_78;
      __l._M_len = 0xb;
      __l._M_array = (iterator)local_e0;
      local_a0 = pPVar3;
      local_98 = pPVar4;
      std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::vector
                (&local_108,__l,&local_ed);
      std::
      vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
      ::push_back(local_80,&local_108);
      uVar6 = local_70;
      if ((void *)CONCAT44(local_108.
                           super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (uint)local_108.
                                 super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_108.
                                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)local_108.
                                               super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start));
      }
      uVar7 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar7;
      local_ec = hidden_dim;
    } while (uVar7 != local_84);
  }
  local_e8->dropout_rate = 0.0;
  return;
}

Assistant:

LSTMBuilder::LSTMBuilder(unsigned layers,
                         unsigned input_dim,
                         unsigned hidden_dim,
                         Model* model) : layers(layers) {
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    // i
    Parameters* p_x2i = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2i = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_c2i = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bi = model->add_parameters({hidden_dim});

    // o
    Parameters* p_x2o = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2o = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_c2o = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bo = model->add_parameters({hidden_dim});

    // c
    Parameters* p_x2c = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2c = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bc = model->add_parameters({hidden_dim});
    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameters*> ps = {p_x2i, p_h2i, p_c2i, p_bi, p_x2o, p_h2o, p_c2o, p_bo, p_x2c, p_h2c, p_bc};
    params.push_back(ps);
  }  // layers
  dropout_rate = 0.0f;
}